

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BestLiteralSelector.hpp
# Opt level: O2

void __thiscall
Kernel::
CompleteBestLiteralSelector<Kernel::LiteralComparators::Composite<Kernel::LiteralComparators::ColoredFirst,_Kernel::LiteralComparators::Composite<Kernel::LiteralComparators::NegativeEquality,_Kernel::LiteralComparators::Composite<Kernel::LiteralComparators::MaximalSize,_Kernel::LiteralComparators::Composite<Kernel::LiteralComparators::Negative,_Kernel::LiteralComparators::LexComparator>_>_>_>_>
::fillMaximals(CompleteBestLiteralSelector<Kernel::LiteralComparators::Composite<Kernel::LiteralComparators::ColoredFirst,_Kernel::LiteralComparators::Composite<Kernel::LiteralComparators::NegativeEquality,_Kernel::LiteralComparators::Composite<Kernel::LiteralComparators::MaximalSize,_Kernel::LiteralComparators::Composite<Kernel::LiteralComparators::Negative,_Kernel::LiteralComparators::LexComparator>_>_>_>_>
               *this,LiteralList **maximals,DArray<Kernel::Literal_*> *litArr)

{
  Literal **ppLVar1;
  long lVar2;
  
  ppLVar1 = litArr->_array;
  for (lVar2 = litArr->_size << 3; lVar2 != 0; lVar2 = lVar2 + -8) {
    Lib::List<Kernel::Literal_*>::push(*(Literal **)((long)ppLVar1 + lVar2 + -8),maximals);
  }
  Ordering::removeNonMaximal((this->super_LiteralSelector)._ord,maximals);
  return;
}

Assistant:

void fillMaximals(LiteralList*& maximals, DArray<Literal*>& litArr)
  {
    DArray<Literal*>::ReversedIterator rlit(litArr);
    while(rlit.hasNext()) {
      Literal* lit=rlit.next();
      LiteralList::push(lit,maximals);
    }
    _ord.removeNonMaximal(maximals);
  }